

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlq.cpp
# Opt level: O0

void __thiscall pg::TLQSolver::TLQSolver(TLQSolver *this,Oink *oink,Game *game)

{
  Game *game_local;
  Oink *oink_local;
  TLQSolver *this_local;
  
  Solver::Solver(&this->super_Solver,oink,game);
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__TLQSolver_0029cbf8;
  this->iterations = 0;
  this->dominions = 0;
  this->tangles = 0;
  std::vector<int_*,_std::allocator<int_*>_>::vector(&this->tout);
  std::vector<int_*,_std::allocator<int_*>_>::vector(&this->tv);
  std::vector<int,_std::allocator<int>_>::vector(&this->tpr);
  uintqueue::uintqueue(&this->pea_state);
  uintqueue::uintqueue(&this->pea_S);
  bitset::bitset(&this->pea_root);
  std::vector<int,_std::allocator<int>_>::vector(&this->tangle);
  uintqueue::uintqueue(&this->tangleto);
  bitset::bitset(&this->escapes);
  uintqueue::uintqueue(&this->Q);
  bitset::bitset(&this->G);
  bitset::bitset(&this->S);
  std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::vector(&this->Rs);
  std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::vector(&this->Hs);
  std::vector<int,_std::allocator<int>_>::vector(&this->Ps);
  std::vector<int,_std::allocator<int>_>::vector(&this->heads);
  bitset::bitset(&this->W0);
  bitset::bitset(&this->W1);
  return;
}

Assistant:

TLQSolver::TLQSolver(Oink& oink, Game& game) : Solver(oink, game)
{
}